

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_opengl.c
# Opt level: O1

MOJOSHADER_glContext *
MOJOSHADER_glCreateContext
          (char *profile,MOJOSHADER_glGetProcAddress lookup,void *lookup_d,MOJOSHADER_malloc m,
          MOJOSHADER_free f,void *malloc_d)

{
  MOJOSHADER_glContext *pMVar1;
  int iVar2;
  MOJOSHADER_glContext *pMVar3;
  code *pcVar4;
  code *pcVar5;
  code *pcVar6;
  code *pcVar7;
  code *pcVar8;
  code *pcVar9;
  code *pcVar10;
  code *pcVar11;
  code *pcVar12;
  code *pcVar13;
  code *pcVar14;
  code *pcVar15;
  code *pcVar16;
  _func_GLint_MOJOSHADER_glProgram_ptr_MOJOSHADER_glShader_ptr_int *local_48;
  _func_GLint_MOJOSHADER_glProgram_ptr_MOJOSHADER_glShader_ptr_int *local_40;
  
  pMVar1 = ctx;
  ctx = (MOJOSHADER_glContext *)0x0;
  if (m == (MOJOSHADER_malloc)0x0) {
    m = MOJOSHADER_internal_malloc;
  }
  if (f == (MOJOSHADER_free)0x0) {
    f = MOJOSHADER_internal_free;
  }
  pMVar3 = (MOJOSHADER_glContext *)(*m)(0x513f8,malloc_d);
  ctx = pMVar3;
  if (pMVar3 == (MOJOSHADER_glContext *)0x0) {
    builtin_strncpy(error_buffer + 8,"emory",6);
    builtin_strncpy(error_buffer,"out of m",8);
  }
  else {
    memset(pMVar3,0,0x513f8);
    pMVar3->malloc_fn = m;
    pMVar3->free_fn = f;
    pMVar3->malloc_data = malloc_d;
    snprintf(pMVar3->profile,0x10,"%s",profile);
    load_extensions(lookup,lookup_d);
    iVar2 = valid_profile(profile);
    if (iVar2 != 0) {
      MOJOSHADER_glBindProgram((MOJOSHADER_glProgram *)0x0);
      if (profile != (char *)0x0) {
        iVar2 = strcmp(profile,"glsl");
        pcVar4 = impl_GLSL_MustPushSamplers;
        pcVar5 = impl_GLSL_MustPushConstantArrays;
        pcVar8 = impl_GLSL_PushSampler;
        pcVar9 = impl_GLSL_PushUniforms;
        pcVar10 = impl_GLSL_PushConstantArray;
        pcVar11 = impl_GLSL_UseProgram;
        pcVar12 = impl_GLSL_FinalInitProgram;
        pcVar13 = impl_GLSL_LinkProgram;
        local_48 = impl_GLSL_GetSamplerLocation;
        local_40 = impl_GLSL_GetUniformLocation;
        pcVar14 = impl_GLSL_GetAttribLocation;
        pcVar7 = impl_GLSL_DeleteProgram;
        pcVar6 = impl_GLSL_DeleteShader;
        pcVar15 = impl_GLSL_CompileShader;
        pcVar16 = impl_GLSL_MaxUniforms;
        if (iVar2 != 0) {
          iVar2 = strcmp(profile,"glsl120");
          if (iVar2 == 0) {
            pcVar4 = impl_GLSL_MustPushSamplers;
            pcVar5 = impl_GLSL_MustPushConstantArrays;
            pcVar8 = impl_GLSL_PushSampler;
            pcVar9 = impl_GLSL_PushUniforms;
            pcVar10 = impl_GLSL_PushConstantArray;
            pcVar11 = impl_GLSL_UseProgram;
            pcVar12 = impl_GLSL_FinalInitProgram;
            pcVar13 = impl_GLSL_LinkProgram;
          }
          else {
            iVar2 = strcmp(profile,"glsles");
            pcVar4 = impl_GLSL_MustPushSamplers;
            pcVar5 = impl_GLSL_MustPushConstantArrays;
            pcVar8 = impl_GLSL_PushSampler;
            pcVar9 = impl_GLSL_PushUniforms;
            pcVar10 = impl_GLSL_PushConstantArray;
            pcVar11 = impl_GLSL_UseProgram;
            pcVar12 = impl_GLSL_FinalInitProgram;
            pcVar13 = impl_GLSL_LinkProgram;
            if (iVar2 != 0) {
              iVar2 = strcmp(profile,"arb1");
              pcVar4 = impl_ARB1_MustPushSamplers;
              pcVar5 = impl_ARB1_MustPushConstantArrays;
              pcVar8 = impl_ARB1_PushSampler;
              pcVar9 = impl_ARB1_PushUniforms;
              pcVar10 = impl_ARB1_PushConstantArray;
              pcVar11 = impl_ARB1_UseProgram;
              pcVar12 = impl_ARB1_FinalInitProgram;
              pcVar13 = impl_ARB1_LinkProgram;
              local_48 = impl_ARB1_GetSamplerLocation;
              local_40 = impl_ARB1_GetUniformLocation;
              pcVar14 = impl_ARB1_GetAttribLocation;
              pcVar7 = impl_ARB1_DeleteProgram;
              pcVar6 = impl_ARB1_DeleteShader;
              pcVar15 = impl_ARB1_CompileShader;
              pcVar16 = impl_ARB1_MaxUniforms;
              if (iVar2 != 0) {
                iVar2 = strcmp(profile,"nv2");
                if ((iVar2 == 0) || (iVar2 = strcmp(profile,"nv3"), iVar2 == 0)) {
                  pcVar4 = impl_ARB1_MustPushSamplers;
                  pcVar5 = impl_ARB1_MustPushConstantArrays;
                  pcVar8 = impl_ARB1_PushSampler;
                  pcVar9 = impl_ARB1_PushUniforms;
                  pcVar10 = impl_ARB1_PushConstantArray;
                  pcVar11 = impl_ARB1_UseProgram;
                  pcVar12 = impl_ARB1_FinalInitProgram;
                  pcVar13 = impl_ARB1_LinkProgram;
                }
                else {
                  iVar2 = strcmp(profile,"nv4");
                  pcVar4 = impl_ARB1_MustPushSamplers;
                  pcVar5 = impl_ARB1_MustPushConstantArrays;
                  pcVar8 = impl_ARB1_PushSampler;
                  pcVar9 = impl_ARB1_PushUniforms;
                  pcVar10 = impl_ARB1_PushConstantArray;
                  pcVar11 = impl_ARB1_UseProgram;
                  pcVar12 = impl_ARB1_FinalInitProgram;
                  pcVar13 = impl_ARB1_LinkProgram;
                  if (iVar2 != 0) goto LAB_001223f3;
                }
              }
            }
          }
        }
        pMVar3 = ctx;
        ctx->profileMaxUniforms = pcVar16;
        pMVar3->profileCompileShader = pcVar15;
        pMVar3->profileDeleteShader = pcVar6;
        pMVar3->profileDeleteProgram = pcVar7;
        pMVar3->profileGetAttribLocation = pcVar14;
        pMVar3->profileGetUniformLocation = local_40;
        pMVar3->profileGetSamplerLocation = local_48;
        pMVar3->profileLinkProgram = pcVar13;
        pMVar3->profileFinalInitProgram = pcVar12;
        pMVar3->profileUseProgram = pcVar11;
        pMVar3->profilePushConstantArray = pcVar10;
        pMVar3->profilePushUniforms = pcVar9;
        pMVar3->profilePushSampler = pcVar8;
        pMVar3->profileMustPushConstantArrays = pcVar5;
        pMVar3->profileMustPushSamplers = pcVar4;
      }
LAB_001223f3:
      if (ctx->profileMaxUniforms == (_func_int_MOJOSHADER_shaderType *)0x0) {
        __assert_fail("ctx->profileMaxUniforms != NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_opengl.c"
                      ,0x5d4,
                      "MOJOSHADER_glContext *MOJOSHADER_glCreateContext(const char *, MOJOSHADER_glGetProcAddress, void *, MOJOSHADER_malloc, MOJOSHADER_free, void *)"
                     );
      }
      if (ctx->profileCompileShader == (_func_int_MOJOSHADER_parseData_ptr_GLuint_ptr *)0x0) {
        __assert_fail("ctx->profileCompileShader != NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_opengl.c"
                      ,0x5d5,
                      "MOJOSHADER_glContext *MOJOSHADER_glCreateContext(const char *, MOJOSHADER_glGetProcAddress, void *, MOJOSHADER_malloc, MOJOSHADER_free, void *)"
                     );
      }
      if (ctx->profileDeleteShader == (_func_void_GLuint *)0x0) {
        __assert_fail("ctx->profileDeleteShader != NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_opengl.c"
                      ,0x5d6,
                      "MOJOSHADER_glContext *MOJOSHADER_glCreateContext(const char *, MOJOSHADER_glGetProcAddress, void *, MOJOSHADER_malloc, MOJOSHADER_free, void *)"
                     );
      }
      if (ctx->profileDeleteProgram == (_func_void_GLuint *)0x0) {
        __assert_fail("ctx->profileDeleteProgram != NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_opengl.c"
                      ,0x5d7,
                      "MOJOSHADER_glContext *MOJOSHADER_glCreateContext(const char *, MOJOSHADER_glGetProcAddress, void *, MOJOSHADER_malloc, MOJOSHADER_free, void *)"
                     );
      }
      if (ctx->profileGetAttribLocation == (_func_GLint_MOJOSHADER_glProgram_ptr_int *)0x0) {
        __assert_fail("ctx->profileGetAttribLocation != NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_opengl.c"
                      ,0x5d9,
                      "MOJOSHADER_glContext *MOJOSHADER_glCreateContext(const char *, MOJOSHADER_glGetProcAddress, void *, MOJOSHADER_malloc, MOJOSHADER_free, void *)"
                     );
      }
      if (ctx->profileGetUniformLocation ==
          (_func_GLint_MOJOSHADER_glProgram_ptr_MOJOSHADER_glShader_ptr_int *)0x0) {
        __assert_fail("ctx->profileGetUniformLocation != NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_opengl.c"
                      ,0x5da,
                      "MOJOSHADER_glContext *MOJOSHADER_glCreateContext(const char *, MOJOSHADER_glGetProcAddress, void *, MOJOSHADER_malloc, MOJOSHADER_free, void *)"
                     );
      }
      if (ctx->profileGetSamplerLocation ==
          (_func_GLint_MOJOSHADER_glProgram_ptr_MOJOSHADER_glShader_ptr_int *)0x0) {
        __assert_fail("ctx->profileGetSamplerLocation != NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_opengl.c"
                      ,0x5db,
                      "MOJOSHADER_glContext *MOJOSHADER_glCreateContext(const char *, MOJOSHADER_glGetProcAddress, void *, MOJOSHADER_malloc, MOJOSHADER_free, void *)"
                     );
      }
      if (ctx->profileLinkProgram !=
          (_func_GLuint_MOJOSHADER_glShader_ptr_MOJOSHADER_glShader_ptr *)0x0) {
        if (ctx->profileFinalInitProgram == (_func_void_MOJOSHADER_glProgram_ptr *)0x0) {
          __assert_fail("ctx->profileFinalInitProgram != NULL",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_opengl.c"
                        ,0x5dd,
                        "MOJOSHADER_glContext *MOJOSHADER_glCreateContext(const char *, MOJOSHADER_glGetProcAddress, void *, MOJOSHADER_malloc, MOJOSHADER_free, void *)"
                       );
        }
        if (ctx->profileUseProgram == (_func_void_MOJOSHADER_glProgram_ptr *)0x0) {
          __assert_fail("ctx->profileUseProgram != NULL",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_opengl.c"
                        ,0x5de,
                        "MOJOSHADER_glContext *MOJOSHADER_glCreateContext(const char *, MOJOSHADER_glGetProcAddress, void *, MOJOSHADER_malloc, MOJOSHADER_free, void *)"
                       );
        }
        if (ctx->profilePushConstantArray ==
            (_func_void_MOJOSHADER_glProgram_ptr_MOJOSHADER_uniform_ptr_GLfloat_ptr *)0x0) {
          __assert_fail("ctx->profilePushConstantArray != NULL",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_opengl.c"
                        ,0x5df,
                        "MOJOSHADER_glContext *MOJOSHADER_glCreateContext(const char *, MOJOSHADER_glGetProcAddress, void *, MOJOSHADER_malloc, MOJOSHADER_free, void *)"
                       );
        }
        if (ctx->profilePushUniforms != (_func_void *)0x0) {
          if (ctx->profilePushSampler == (_func_void_GLint_GLuint *)0x0) {
            __assert_fail("ctx->profilePushSampler != NULL",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_opengl.c"
                          ,0x5e1,
                          "MOJOSHADER_glContext *MOJOSHADER_glCreateContext(const char *, MOJOSHADER_glGetProcAddress, void *, MOJOSHADER_malloc, MOJOSHADER_free, void *)"
                         );
          }
          if (ctx->profileMustPushConstantArrays != (_func_int *)0x0) {
            if (ctx->profileMustPushSamplers != (_func_int *)0x0) {
              pMVar3 = ctx;
              ctx = pMVar1;
              return pMVar3;
            }
            __assert_fail("ctx->profileMustPushSamplers != NULL",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_opengl.c"
                          ,0x5e3,
                          "MOJOSHADER_glContext *MOJOSHADER_glCreateContext(const char *, MOJOSHADER_glGetProcAddress, void *, MOJOSHADER_malloc, MOJOSHADER_free, void *)"
                         );
          }
          __assert_fail("ctx->profileMustPushConstantArrays != NULL",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_opengl.c"
                        ,0x5e2,
                        "MOJOSHADER_glContext *MOJOSHADER_glCreateContext(const char *, MOJOSHADER_glGetProcAddress, void *, MOJOSHADER_malloc, MOJOSHADER_free, void *)"
                       );
        }
        __assert_fail("ctx->profilePushUniforms != NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_opengl.c"
                      ,0x5e0,
                      "MOJOSHADER_glContext *MOJOSHADER_glCreateContext(const char *, MOJOSHADER_glGetProcAddress, void *, MOJOSHADER_malloc, MOJOSHADER_free, void *)"
                     );
      }
      __assert_fail("ctx->profileLinkProgram != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_opengl.c"
                    ,0x5dc,
                    "MOJOSHADER_glContext *MOJOSHADER_glCreateContext(const char *, MOJOSHADER_glGetProcAddress, void *, MOJOSHADER_malloc, MOJOSHADER_free, void *)"
                   );
    }
  }
  if (ctx != (MOJOSHADER_glContext *)0x0) {
    (*f)(ctx,malloc_d);
  }
  ctx = pMVar1;
  return (MOJOSHADER_glContext *)0x0;
}

Assistant:

MOJOSHADER_glContext *MOJOSHADER_glCreateContext(const char *profile,
                                        MOJOSHADER_glGetProcAddress lookup,
                                        void *lookup_d,
                                        MOJOSHADER_malloc m, MOJOSHADER_free f,
                                        void *malloc_d)
{
    MOJOSHADER_glContext *retval = NULL;
    MOJOSHADER_glContext *current_ctx = ctx;

    ctx = NULL;

    if (m == NULL) m = MOJOSHADER_internal_malloc;
    if (f == NULL) f = MOJOSHADER_internal_free;

    ctx = (MOJOSHADER_glContext *) m(sizeof (MOJOSHADER_glContext), malloc_d);
    if (ctx == NULL)
    {
        out_of_memory();
        goto init_fail;
    } // if

    memset(ctx, '\0', sizeof (MOJOSHADER_glContext));
    ctx->malloc_fn = m;
    ctx->free_fn = f;
    ctx->malloc_data = malloc_d;
    snprintf(ctx->profile, sizeof (ctx->profile), "%s", profile);

    load_extensions(lookup, lookup_d);
    if (!valid_profile(profile))
        goto init_fail;

#ifdef MOJOSHADER_XNA4_VERTEX_TEXTURES
        GLint maxTextures;
        GLint maxVertexTextures;
        ctx->glGetIntegerv(GL_MAX_TEXTURE_IMAGE_UNITS, &maxTextures);
        maxVertexTextures = ((maxTextures - 16) < 4) ? (maxTextures - 16) : 4;
        ctx->vertex_sampler_offset = maxTextures - maxVertexTextures;
#endif

    MOJOSHADER_glBindProgram(NULL);

    // !!! FIXME: generalize this part.
    if (profile == NULL) {}

    // We don't check SUPPORT_PROFILE_GLSL120/ES here, since valid_profile() does.
#if SUPPORT_PROFILE_GLSL
    else if ( (strcmp(profile, MOJOSHADER_PROFILE_GLSL) == 0) ||
              (strcmp(profile, MOJOSHADER_PROFILE_GLSL120) == 0) ||
              (strcmp(profile, MOJOSHADER_PROFILE_GLSLES) == 0) )
    {
        ctx->profileMaxUniforms = impl_GLSL_MaxUniforms;
        ctx->profileCompileShader = impl_GLSL_CompileShader;
        ctx->profileDeleteShader = impl_GLSL_DeleteShader;
        ctx->profileDeleteProgram = impl_GLSL_DeleteProgram;
        ctx->profileGetAttribLocation = impl_GLSL_GetAttribLocation;
        ctx->profileGetUniformLocation = impl_GLSL_GetUniformLocation;
        ctx->profileGetSamplerLocation = impl_GLSL_GetSamplerLocation;
        ctx->profileLinkProgram = impl_GLSL_LinkProgram;
        ctx->profileFinalInitProgram = impl_GLSL_FinalInitProgram;
        ctx->profileUseProgram = impl_GLSL_UseProgram;
        ctx->profilePushConstantArray = impl_GLSL_PushConstantArray;
        ctx->profilePushUniforms = impl_GLSL_PushUniforms;
        ctx->profilePushSampler = impl_GLSL_PushSampler;
        ctx->profileMustPushConstantArrays = impl_GLSL_MustPushConstantArrays;
        ctx->profileMustPushSamplers = impl_GLSL_MustPushSamplers;
    } // if
#endif

    // We don't check SUPPORT_PROFILE_ARB1_NV here, since valid_profile() does.
#if SUPPORT_PROFILE_ARB1
    else if ( (strcmp(profile, MOJOSHADER_PROFILE_ARB1) == 0) ||
              (strcmp(profile, MOJOSHADER_PROFILE_NV2) == 0) ||
              (strcmp(profile, MOJOSHADER_PROFILE_NV3) == 0) ||
              (strcmp(profile, MOJOSHADER_PROFILE_NV4) == 0) )
    {
        ctx->profileMaxUniforms = impl_ARB1_MaxUniforms;
        ctx->profileCompileShader = impl_ARB1_CompileShader;
        ctx->profileDeleteShader = impl_ARB1_DeleteShader;
        ctx->profileDeleteProgram = impl_ARB1_DeleteProgram;
        ctx->profileGetAttribLocation = impl_ARB1_GetAttribLocation;
        ctx->profileGetUniformLocation = impl_ARB1_GetUniformLocation;
        ctx->profileGetSamplerLocation = impl_ARB1_GetSamplerLocation;
        ctx->profileLinkProgram = impl_ARB1_LinkProgram;
        ctx->profileFinalInitProgram = impl_ARB1_FinalInitProgram;
        ctx->profileUseProgram = impl_ARB1_UseProgram;
        ctx->profilePushConstantArray = impl_ARB1_PushConstantArray;
        ctx->profilePushUniforms = impl_ARB1_PushUniforms;
        ctx->profilePushSampler = impl_ARB1_PushSampler;
        ctx->profileMustPushConstantArrays = impl_ARB1_MustPushConstantArrays;
        ctx->profileMustPushSamplers = impl_ARB1_MustPushSamplers;
    } // if
#endif

    assert(ctx->profileMaxUniforms != NULL);
    assert(ctx->profileCompileShader != NULL);
    assert(ctx->profileDeleteShader != NULL);
    assert(ctx->profileDeleteProgram != NULL);
    assert(ctx->profileMaxUniforms != NULL);
    assert(ctx->profileGetAttribLocation != NULL);
    assert(ctx->profileGetUniformLocation != NULL);
    assert(ctx->profileGetSamplerLocation != NULL);
    assert(ctx->profileLinkProgram != NULL);
    assert(ctx->profileFinalInitProgram != NULL);
    assert(ctx->profileUseProgram != NULL);
    assert(ctx->profilePushConstantArray != NULL);
    assert(ctx->profilePushUniforms != NULL);
    assert(ctx->profilePushSampler != NULL);
    assert(ctx->profileMustPushConstantArrays != NULL);
    assert(ctx->profileMustPushSamplers != NULL);

    retval = ctx;
    ctx = current_ctx;
    return retval;

init_fail:
    if (ctx != NULL)
        f(ctx, malloc_d);
    ctx = current_ctx;
    return NULL;
}